

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asynclog.cpp
# Opt level: O0

void __thiscall AsyncLog::Start(AsyncLog *this)

{
  type mutex;
  pointer this_00;
  LockGuard local_18;
  LockGuard lock;
  AsyncLog *this_local;
  
  this->m_bRunning = true;
  lock.m_mutex = (Mutex *)this;
  Thread::Start(&this->m_thread);
  mutex = std::unique_ptr<Mutex,_std::default_delete<Mutex>_>::operator*(&this->m_mutex);
  LockGuard::LockGuard(&local_18,mutex);
  this_00 = std::unique_ptr<Condition,_std::default_delete<Condition>_>::operator->
                      (&this->m_mainThreadRunCond);
  Condition::Wait(this_00);
  LockGuard::~LockGuard(&local_18);
  return;
}

Assistant:

void AsyncLog::Start()
{
	m_bRunning = true;
	m_thread.Start();
	LockGuard lock(*m_mutex);
	m_mainThreadRunCond->Wait();
	//std::cout << "Main thread Running " << __LINE__ << std::endl;
}